

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsmooth.c
# Opt level: O1

FT_Error ft_smooth_render(FT_Renderer_conflict render,FT_GlyphSlot slot,FT_Render_Mode mode,
                         FT_Vector *origin)

{
  FT_UInt *pFVar1;
  FT_Bool FVar2;
  uchar *puVar3;
  int iVar4;
  FT_Outline *pFVar5;
  ulong new_count;
  long lVar6;
  FT_Memory pFVar7;
  long xOffset;
  FT_Error error;
  FT_Raster_Params params;
  FT_Error local_ac;
  FT_Outline *local_a8;
  FT_Memory local_a0;
  FT_Bitmap *local_98;
  FT_Raster_Params local_90;
  
  local_ac = 0;
  pFVar5 = &slot->outline;
  pFVar7 = (render->root).memory;
  if (slot->format == render->glyph_format) {
    if ((mode < FT_RENDER_MODE_SDF) && (mode != FT_RENDER_MODE_MONO)) {
      local_a8 = pFVar5;
      local_a0 = pFVar7;
      if ((slot->internal->flags & 1) != 0) {
        ft_mem_free(pFVar7,(slot->bitmap).buffer);
        (slot->bitmap).buffer = (uchar *)0x0;
        pFVar1 = &slot->internal->flags;
        *pFVar1 = *pFVar1 & 0xfffffffe;
      }
      FVar2 = ft_glyphslot_preset_bitmap(slot,mode,origin);
      pFVar5 = local_a8;
      pFVar7 = local_a0;
      if (FVar2 == '\0') {
        new_count = (ulong)(slot->bitmap).rows;
        if ((new_count == 0) || (lVar6 = (long)(slot->bitmap).pitch, lVar6 == 0)) {
          xOffset = 0;
          lVar6 = 0;
        }
        else {
          xOffset = 0;
          local_98 = &slot->bitmap;
          puVar3 = (uchar *)ft_mem_realloc(local_a0,lVar6,0,new_count,(void *)0x0,&local_ac);
          (slot->bitmap).buffer = puVar3;
          lVar6 = 0;
          pFVar5 = local_a8;
          pFVar7 = local_a0;
          if (local_ac == 0) {
            pFVar1 = &slot->internal->flags;
            *pFVar1 = *pFVar1 | 1;
            xOffset = (long)(slot->bitmap_left * -0x40);
            iVar4 = (slot->bitmap).rows << 6;
            if ((slot->bitmap).pixel_mode == '\x06') {
              iVar4 = iVar4 / 3;
            }
            lVar6 = (long)iVar4 + (long)(slot->bitmap_top * -0x40);
            if (origin != (FT_Vector *)0x0) {
              xOffset = xOffset + origin->x;
              lVar6 = lVar6 + origin->y;
            }
            if (xOffset != 0 || lVar6 != 0) {
              FT_Outline_Translate(local_a8,xOffset,lVar6);
            }
            if (mode < FT_RENDER_MODE_MONO) {
              if (((slot->outline).flags & 0x40) == 0) {
                local_90.target = local_98;
                local_90.source = local_a8;
                local_90.flags = 1;
                local_ac = (*render->raster_render)(render->raster,&local_90);
                pFVar5 = local_a8;
                pFVar7 = local_a0;
              }
              else {
                local_ac = ft_smooth_raster_overlap(render,local_a8,local_98);
                pFVar5 = local_a8;
                pFVar7 = local_a0;
              }
            }
            else if (mode == FT_RENDER_MODE_LCD_V) {
              local_ac = ft_smooth_raster_lcdv(render,local_a8,local_98);
              pFVar5 = local_a8;
              pFVar7 = local_a0;
            }
            else {
              pFVar5 = local_a8;
              pFVar7 = local_a0;
              if (mode == FT_RENDER_MODE_LCD) {
                local_ac = ft_smooth_raster_lcd(render,local_a8,local_98);
                pFVar5 = local_a8;
                pFVar7 = local_a0;
              }
            }
          }
        }
      }
      else {
        local_ac = 0x62;
        xOffset = 0;
        lVar6 = 0;
      }
      goto LAB_002515a9;
    }
    local_ac = 0x13;
  }
  else {
    local_ac = 6;
  }
  xOffset = 0;
  lVar6 = 0;
LAB_002515a9:
  if (local_ac == 0) {
    slot->format = FT_GLYPH_FORMAT_BITMAP;
  }
  else if ((slot->internal->flags & 1) != 0) {
    ft_mem_free(pFVar7,(slot->bitmap).buffer);
    (slot->bitmap).buffer = (uchar *)0x0;
    pFVar1 = &slot->internal->flags;
    *pFVar1 = *pFVar1 & 0xfffffffe;
  }
  if (xOffset != 0 || lVar6 != 0) {
    FT_Outline_Translate(pFVar5,-xOffset,-lVar6);
  }
  return local_ac;
}

Assistant:

static FT_Error
  ft_smooth_render( FT_Renderer       render,
                    FT_GlyphSlot      slot,
                    FT_Render_Mode    mode,
                    const FT_Vector*  origin )
  {
    FT_Error     error   = FT_Err_Ok;
    FT_Outline*  outline = &slot->outline;
    FT_Bitmap*   bitmap  = &slot->bitmap;
    FT_Memory    memory  = render->root.memory;
    FT_Pos       x_shift = 0;
    FT_Pos       y_shift = 0;


    /* check glyph image format */
    if ( slot->format != render->glyph_format )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* check mode */
    if ( mode != FT_RENDER_MODE_NORMAL &&
         mode != FT_RENDER_MODE_LIGHT  &&
         mode != FT_RENDER_MODE_LCD    &&
         mode != FT_RENDER_MODE_LCD_V  )
    {
      error = FT_THROW( Cannot_Render_Glyph );
      goto Exit;
    }

    /* release old bitmap buffer */
    if ( slot->internal->flags & FT_GLYPH_OWN_BITMAP )
    {
      FT_FREE( bitmap->buffer );
      slot->internal->flags &= ~FT_GLYPH_OWN_BITMAP;
    }

    if ( ft_glyphslot_preset_bitmap( slot, mode, origin ) )
    {
      error = FT_THROW( Raster_Overflow );
      goto Exit;
    }

    if ( !bitmap->rows || !bitmap->pitch )
      goto Exit;

    /* allocate new one */
    if ( FT_ALLOC_MULT( bitmap->buffer, bitmap->rows, bitmap->pitch ) )
      goto Exit;

    slot->internal->flags |= FT_GLYPH_OWN_BITMAP;

    x_shift = 64 * -slot->bitmap_left;
    y_shift = 64 * -slot->bitmap_top;
    if ( bitmap->pixel_mode == FT_PIXEL_MODE_LCD_V )
      y_shift += 64 * (FT_Int)bitmap->rows / 3;
    else
      y_shift += 64 * (FT_Int)bitmap->rows;

    if ( origin )
    {
      x_shift += origin->x;
      y_shift += origin->y;
    }

    /* translate outline to render it into the bitmap */
    if ( x_shift || y_shift )
      FT_Outline_Translate( outline, x_shift, y_shift );

    if ( mode == FT_RENDER_MODE_NORMAL ||
         mode == FT_RENDER_MODE_LIGHT  )
    {
      if ( outline->flags & FT_OUTLINE_OVERLAP )
        error = ft_smooth_raster_overlap( render, outline, bitmap );
      else
      {
        FT_Raster_Params  params;


        params.target = bitmap;
        params.source = outline;
        params.flags  = FT_RASTER_FLAG_AA;

        error = render->raster_render( render->raster, &params );
      }
    }
    else
    {
      if ( mode == FT_RENDER_MODE_LCD )
        error = ft_smooth_raster_lcd ( render, outline, bitmap );
      else if ( mode == FT_RENDER_MODE_LCD_V )
        error = ft_smooth_raster_lcdv( render, outline, bitmap );

#ifdef FT_CONFIG_OPTION_SUBPIXEL_RENDERING

      /* finally apply filtering */
      {
        FT_Byte*                 lcd_weights;
        FT_Bitmap_LcdFilterFunc  lcd_filter_func;


        /* Per-face LCD filtering takes priority if set up. */
        if ( slot->face && slot->face->internal->lcd_filter_func )
        {
          lcd_weights     = slot->face->internal->lcd_weights;
          lcd_filter_func = slot->face->internal->lcd_filter_func;
        }
        else
        {
          lcd_weights     = slot->library->lcd_weights;
          lcd_filter_func = slot->library->lcd_filter_func;
        }

        if ( lcd_filter_func )
          lcd_filter_func( bitmap, lcd_weights );
      }

#endif /* FT_CONFIG_OPTION_SUBPIXEL_RENDERING */

    }

  Exit:
    if ( !error )
    {
      /* everything is fine; the glyph is now officially a bitmap */
      slot->format = FT_GLYPH_FORMAT_BITMAP;
    }
    else if ( slot->internal->flags & FT_GLYPH_OWN_BITMAP )
    {
      FT_FREE( bitmap->buffer );
      slot->internal->flags &= ~FT_GLYPH_OWN_BITMAP;
    }

    if ( x_shift || y_shift )
      FT_Outline_Translate( outline, -x_shift, -y_shift );

    return error;
  }